

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

bool __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSqrt<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>_>_>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>
::hasFastAccess(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSqrt<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>_>_>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>
                *this)

{
  bool bVar1;
  undefined1 local_9;
  
  bVar1 = FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSqrt<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>_>_>_>_>,_Fad<double>_>_>
          ::hasFastAccess((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSqrt<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>_>_>_>_>,_Fad<double>_>_>
                           *)0x1ec8b7a);
  local_9 = false;
  if (bVar1) {
    local_9 = FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              ::hasFastAccess((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                               *)0x1ec8b96);
  }
  return local_9;
}

Assistant:

bool hasFastAccess() const { return left_.hasFastAccess() && right_.hasFastAccess();}